

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall Dfa::min_Dfa(Dfa *this)

{
  allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_> *this_00;
  size_t *this_01;
  int iVar1;
  int iVar2;
  value_type pFVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  reference ppFVar7;
  reference ppFVar8;
  reference pEVar9;
  reference pvVar10;
  reference pvVar11;
  reference piVar12;
  mapped_type *this_02;
  reference ppVar13;
  Fa_Node *pFVar14;
  reference pEVar15;
  vector<bool,_std::allocator<bool>_> *this_03;
  iterator iVar16;
  undefined1 auStack_3d8 [8];
  Edge j_6;
  _Self local_3c0;
  iterator __end2_2;
  iterator __begin2_2;
  set<Edge,_std::less<Edge>,_std::allocator<Edge>_> *__range2_2;
  undefined1 auStack_398 [8];
  Edge j_5;
  iterator __end2_1;
  iterator __begin2_1;
  vector<Edge,_std::allocator<Edge>_> *__range2_1;
  undefined1 local_368 [4];
  int i_10;
  set<Edge,_std::less<Edge>,_std::allocator<Edge>_> edge_tp;
  undefined8 uStack_330;
  int i_9;
  Edge k_2;
  iterator __end3_3;
  iterator __begin3_3;
  vector<Edge,_std::allocator<Edge>_> *__range3_3;
  int i_8;
  int j_4;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  int local_2e0;
  int q;
  int i_7;
  int j_3;
  iterator __end3_2;
  iterator __begin3_2;
  value_type *__range3_2;
  int i_6;
  pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_> *j_2;
  iterator __end3_1;
  iterator __begin3_1;
  map<Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<Node_num_edge>,_std::allocator<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  *__range3_1;
  int tp_cnt;
  pair<char,_int> local_270;
  pair<char,_int> pair_tp;
  Edge k_1;
  iterator __end4_1;
  iterator __begin4_1;
  vector<Edge,_std::allocator<Edge>_> *__range4_1;
  iterator iStack_238;
  int j_1;
  iterator __end3;
  iterator __begin3;
  value_type *__range3;
  int i_5;
  int local_1f4;
  undefined1 local_1f0 [4];
  int i_4;
  set<int,_std::less<int>,_std::allocator<int>_> node_tp;
  Node_num_edge to_tp;
  map<Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<Node_num_edge>,_std::allocator<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  mp;
  undefined1 local_158 [8];
  vector<Fa_Node_*,_std::allocator<Fa_Node_*>_> new_Node;
  undefined1 local_138 [8];
  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
  new_node_set;
  int i_3;
  allocator<int> local_109;
  undefined1 local_108 [8];
  vector<int,_std::allocator<int>_> belong;
  Edge j;
  iterator __end4;
  iterator __begin4;
  vector<Edge,_std::allocator<Edge>_> *__range4;
  reference local_b8;
  value_type *i_2;
  int local_a8;
  int k;
  int tot;
  int last_tot;
  Fa_Node *local_90;
  Fa_Node *i_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<Fa_Node_*,_std::allocator<Fa_Node_*>_> *__range1_1;
  undefined1 auStack_68 [7];
  bool okflag;
  reference i;
  undefined1 local_48 [8];
  iterator __end1;
  undefined1 local_28 [8];
  iterator __begin1;
  vector<bool,_std::allocator<bool>_> *__range1;
  Dfa *this_local;
  
  this_03 = &this->used;
  std::vector<bool,_std::allocator<bool>_>::resize(this_03,(long)(this->n + 1),false);
  __begin1.super__Bit_iterator_base._8_8_ = this_03;
  iVar16 = std::vector<bool,_std::allocator<bool>_>::begin(this_03);
  __end1.super__Bit_iterator_base._8_8_ = iVar16.super__Bit_iterator_base._M_p;
  __begin1.super__Bit_iterator_base._M_p._0_4_ = iVar16.super__Bit_iterator_base._M_offset;
  local_28 = (undefined1  [8])__end1.super__Bit_iterator_base._8_8_;
  iVar16 = std::vector<bool,_std::allocator<bool>_>::end
                     ((vector<bool,_std::allocator<bool>_> *)__begin1.super__Bit_iterator_base._8_8_
                     );
  i._M_mask = (_Bit_type)iVar16.super__Bit_iterator_base._M_p;
  __end1.super__Bit_iterator_base._M_p._0_4_ = iVar16.super__Bit_iterator_base._M_offset;
  local_48 = (undefined1  [8])i._M_mask;
  while (bVar4 = std::operator!=((_Bit_iterator_base *)local_28,(_Bit_iterator_base *)local_48),
        bVar4) {
    _auStack_68 = std::_Bit_iterator::operator*((_Bit_iterator *)local_28);
    std::_Bit_reference::operator=((_Bit_reference *)auStack_68,false);
    std::_Bit_iterator::operator++((_Bit_iterator *)local_28);
  }
  ppFVar7 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[](&this->Node,1);
  bVar4 = (bool)(((*ppFVar7)->temp ^ 0xffU) & 1);
  __end1_1 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::begin(&this->begin);
  i_1 = (Fa_Node *)std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::end(&this->begin);
  while (bVar5 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<Fa_Node_**,_std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>_>
                             *)&i_1), bVar5) {
    ppFVar8 = __gnu_cxx::
              __normal_iterator<Fa_Node_**,_std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>_>::
              operator*(&__end1_1);
    local_90 = *ppFVar8;
    _tot = std::vector<bool,_std::allocator<bool>_>::operator[](&this->used,(long)local_90->n);
    bVar5 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&tot);
    if (((bVar5 ^ 0xffU) & 1) != 0) {
      dfs_del_unreachable_node(this,local_90->n,bVar4);
    }
    __gnu_cxx::__normal_iterator<Fa_Node_**,_std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>_>::
    operator++(&__end1_1);
  }
  k = -1;
  local_a8 = 0;
  do {
    if (k == local_a8) {
      iVar1 = this->n;
      std::allocator<int>::allocator(&local_109);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)local_108,(long)(iVar1 + 1),&local_109);
      std::allocator<int>::~allocator(&local_109);
      for (new_node_set.
           super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
          (int)new_node_set.
               super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage <= this->n;
          new_node_set.
          super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
               (int)new_node_set.
                    super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
        ppFVar7 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                            (&this->Node,
                             (long)(int)new_node_set.
                                        super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if ((bool)((*ppFVar7)->temp & 1U) == bVar4) {
          ppFVar7 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                              (&this->Node,
                               (long)(int)new_node_set.
                                          super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (((*ppFVar7)->end & 1U) == 0) {
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)local_108,
                                 (long)(int)new_node_set.
                                            super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
            *pvVar10 = 1;
          }
          else {
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)local_108,
                                 (long)(int)new_node_set.
                                            super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
            *pvVar10 = 2;
          }
        }
        else {
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)local_108,
                               (long)(int)new_node_set.
                                          super__Vector_base<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
          *pvVar10 = 0;
        }
      }
      this_00 = (allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_> *)
                ((long)&new_Node.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage + 7);
      std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>::allocator(this_00);
      std::
      vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
      ::vector((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                *)local_138,3,this_00);
      std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>::~allocator
                ((allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_> *)
                 ((long)&new_Node.super__Vector_base<Fa_Node_*,_std::allocator<Fa_Node_*>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::vector
                ((vector<Fa_Node_*,_std::allocator<Fa_Node_*>_> *)local_158);
      mp._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::push_back
                ((vector<Fa_Node_*,_std::allocator<Fa_Node_*>_> *)local_158,
                 (value_type *)&mp._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      map<Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<Node_num_edge>,_std::allocator<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
      ::map((map<Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<Node_num_edge>,_std::allocator<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
             *)&to_tp.n._M_t._M_impl.super__Rb_tree_header._M_node_count);
      Node_num_edge::Node_num_edge
                ((Node_num_edge *)&node_tp._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::set<int,_std::less<int>,_std::allocator<int>_>::set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)local_1f0);
      local_a8 = 2;
      k = 0;
      for (local_1f4 = 1; local_1f4 <= this->n; local_1f4 = local_1f4 + 1) {
        ppFVar7 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                            (&this->Node,(long)local_1f4);
        if ((bool)((*ppFVar7)->temp & 1U) == bVar4) {
          ppFVar7 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                              (&this->Node,(long)local_1f4);
          if (((*ppFVar7)->end & 1U) == 0) {
            pvVar11 = std::
                      vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                      ::operator[]((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                    *)local_138,1);
            ppFVar7 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                                (&this->Node,(long)local_1f4);
            std::set<int,_std::less<int>,_std::allocator<int>_>::insert(pvVar11,&(*ppFVar7)->n);
          }
          else {
            pvVar11 = std::
                      vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                      ::operator[]((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                    *)local_138,2);
            ppFVar7 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                                (&this->Node,(long)local_1f4);
            std::set<int,_std::less<int>,_std::allocator<int>_>::insert(pvVar11,&(*ppFVar7)->n);
          }
        }
      }
      while (k != local_a8) {
        k = local_a8;
        for (__range3._4_4_ = 1; __range3._4_4_ <= k; __range3._4_4_ = __range3._4_4_ + 1) {
          std::
          map<Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<Node_num_edge>,_std::allocator<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
          ::clear((map<Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<Node_num_edge>,_std::allocator<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                   *)&to_tp.n._M_t._M_impl.super__Rb_tree_header._M_node_count);
          pvVar11 = std::
                    vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                    ::operator[]((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                  *)local_138,(long)__range3._4_4_);
          __end3 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(pvVar11);
          iStack_238 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(pvVar11);
          while (bVar5 = std::operator!=(&__end3,&stack0xfffffffffffffdc8), bVar5) {
            piVar12 = std::_Rb_tree_const_iterator<int>::operator*(&__end3);
            __range4_1._4_4_ = *piVar12;
            std::
            set<std::pair<char,_int>,_std::less<std::pair<char,_int>_>,_std::allocator<std::pair<char,_int>_>_>
            ::clear((set<std::pair<char,_int>,_std::less<std::pair<char,_int>_>,_std::allocator<std::pair<char,_int>_>_>
                     *)&node_tp._M_t._M_impl.super__Rb_tree_header._M_node_count);
            ppFVar7 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                                (&this->Node,(long)__range4_1._4_4_);
            pFVar3 = *ppFVar7;
            __end4_1 = std::vector<Edge,_std::allocator<Edge>_>::begin(&pFVar3->edge);
            k_1.v = (Fa_Node *)std::vector<Edge,_std::allocator<Edge>_>::end(&pFVar3->edge);
            while (bVar5 = __gnu_cxx::operator!=
                                     (&__end4_1,
                                      (__normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>
                                       *)&k_1.v), bVar5) {
              pEVar9 = __gnu_cxx::
                       __normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>::
                       operator*(&__end4_1);
              pair_tp.first = pEVar9->c;
              pair_tp._1_3_ = *(undefined3 *)&pEVar9->field_0x1;
              pair_tp.second = *(int *)&pEVar9->field_0x4;
              k_1._0_8_ = pEVar9->v;
              if ((bool)(((Fa_Node *)k_1._0_8_)->temp & 1U) == bVar4) {
                pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)local_108,
                                     (long)((Fa_Node *)k_1._0_8_)->n);
                std::pair<char,_int>::pair<char_&,_int_&,_true>(&local_270,&pair_tp.first,pvVar10);
                std::
                set<std::pair<char,_int>,_std::less<std::pair<char,_int>_>,_std::allocator<std::pair<char,_int>_>_>
                ::insert((set<std::pair<char,_int>,_std::less<std::pair<char,_int>_>,_std::allocator<std::pair<char,_int>_>_>
                          *)&node_tp._M_t._M_impl.super__Rb_tree_header._M_node_count,&local_270);
              }
              __gnu_cxx::__normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>::
              operator++(&__end4_1);
            }
            this_02 = std::
                      map<Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<Node_num_edge>,_std::allocator<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                      ::operator[]((map<Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<Node_num_edge>,_std::allocator<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                                    *)&to_tp.n._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                   (key_type *)
                                   &node_tp._M_t._M_impl.super__Rb_tree_header._M_node_count);
            std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                      (this_02,(value_type_conflict1 *)((long)&__range4_1 + 4));
            std::_Rb_tree_const_iterator<int>::operator++(&__end3);
          }
          bVar5 = false;
          this_01 = &to_tp.n._M_t._M_impl.super__Rb_tree_header._M_node_count;
          __end3_1 = std::
                     map<Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<Node_num_edge>,_std::allocator<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                     ::begin((map<Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<Node_num_edge>,_std::allocator<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                              *)this_01);
          j_2 = (pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_> *)
                std::
                map<Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<Node_num_edge>,_std::allocator<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                ::end((map<Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<Node_num_edge>,_std::allocator<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                       *)this_01);
          while (bVar6 = std::operator!=(&__end3_1,(_Self *)&j_2), bVar6) {
            ppVar13 = std::
                      _Rb_tree_iterator<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                      ::operator*(&__end3_1);
            if (bVar5) {
              local_a8 = local_a8 + 1;
              std::
              vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
              ::push_back((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                           *)local_138,&ppVar13->second);
            }
            else {
              pvVar11 = std::
                        vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                        ::operator[]((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                      *)local_138,(long)__range3._4_4_);
              std::set<int,_std::less<int>,_std::allocator<int>_>::clear(pvVar11);
              pvVar11 = std::
                        vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                        ::operator[]((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                      *)local_138,(long)__range3._4_4_);
              std::set<int,_std::less<int>,_std::allocator<int>_>::operator=
                        (pvVar11,&ppVar13->second);
              bVar5 = true;
            }
            std::
            _Rb_tree_iterator<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
            ::operator++(&__end3_1);
          }
        }
        for (__range3_2._4_4_ = 1; __range3_2._4_4_ <= local_a8;
            __range3_2._4_4_ = __range3_2._4_4_ + 1) {
          pvVar11 = std::
                    vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                    ::operator[]((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                  *)local_138,(long)__range3_2._4_4_);
          __end3_2 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(pvVar11);
          _i_7 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(pvVar11);
          while (bVar5 = std::operator!=(&__end3_2,(_Self *)&i_7), bVar5) {
            piVar12 = std::_Rb_tree_const_iterator<int>::operator*(&__end3_2);
            pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)local_108,(long)*piVar12);
            *pvVar10 = __range3_2._4_4_;
            std::_Rb_tree_const_iterator<int>::operator++(&__end3_2);
          }
        }
      }
      std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::resize
                ((vector<Fa_Node_*,_std::allocator<Fa_Node_*>_> *)local_158,(long)(local_a8 + 1));
      for (local_2e0 = 1; local_2e0 <= local_a8; local_2e0 = local_2e0 + 1) {
        pFVar14 = (Fa_Node *)operator_new(0x28);
        Fa_Node::Fa_Node(pFVar14,local_2e0,false,false);
        ppFVar7 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                            ((vector<Fa_Node_*,_std::allocator<Fa_Node_*>_> *)local_158,
                             (long)local_2e0);
        *ppFVar7 = pFVar14;
      }
      std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::clear(&this->begin);
      std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::clear(&this->end);
      for (__range2._4_4_ = 1; __range2._4_4_ <= local_a8; __range2._4_4_ = __range2._4_4_ + 1) {
        pvVar11 = std::
                  vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                  ::operator[]((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                                *)local_138,(long)__range2._4_4_);
        __end2 = std::set<int,_std::less<int>,_std::allocator<int>_>::begin(pvVar11);
        _i_8 = std::set<int,_std::less<int>,_std::allocator<int>_>::end(pvVar11);
        while (bVar5 = std::operator!=(&__end2,(_Self *)&i_8), bVar5) {
          piVar12 = std::_Rb_tree_const_iterator<int>::operator*(&__end2);
          iVar1 = *piVar12;
          pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)local_108,(long)iVar1);
          iVar2 = *pvVar10;
          ppFVar7 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                              (&this->Node,(long)iVar1);
          if (((*ppFVar7)->start & 1U) != 0) {
            ppFVar7 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                                ((vector<Fa_Node_*,_std::allocator<Fa_Node_*>_> *)local_158,
                                 (long)iVar2);
            (*ppFVar7)->start = true;
            ppFVar7 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                                ((vector<Fa_Node_*,_std::allocator<Fa_Node_*>_> *)local_158,
                                 (long)iVar2);
            std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::push_back(&this->begin,ppFVar7);
          }
          ppFVar7 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                              (&this->Node,(long)iVar1);
          if (((*ppFVar7)->end & 1U) != 0) {
            ppFVar7 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                                ((vector<Fa_Node_*,_std::allocator<Fa_Node_*>_> *)local_158,
                                 (long)iVar2);
            (*ppFVar7)->end = true;
            ppFVar7 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                                ((vector<Fa_Node_*,_std::allocator<Fa_Node_*>_> *)local_158,
                                 (long)iVar2);
            std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::push_back(&this->end,ppFVar7);
          }
          ppFVar7 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                              (&this->Node,(long)iVar1);
          pFVar3 = *ppFVar7;
          __end3_3 = std::vector<Edge,_std::allocator<Edge>_>::begin(&pFVar3->edge);
          k_2.v = (Fa_Node *)std::vector<Edge,_std::allocator<Edge>_>::end(&pFVar3->edge);
          while (bVar5 = __gnu_cxx::operator!=
                                   (&__end3_3,
                                    (__normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>
                                     *)&k_2.v), bVar5) {
            pEVar9 = __gnu_cxx::__normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>
                     ::operator*(&__end3_3);
            uStack_330 = *(undefined8 *)pEVar9;
            k_2._0_8_ = pEVar9->v;
            if ((bool)(((Fa_Node *)k_2._0_8_)->temp & 1U) == bVar4) {
              ppFVar7 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                                  ((vector<Fa_Node_*,_std::allocator<Fa_Node_*>_> *)local_158,
                                   (long)iVar2);
              pFVar3 = *ppFVar7;
              pvVar10 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)local_108,
                                   (long)*(int *)k_2._0_8_);
              ppFVar7 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                                  ((vector<Fa_Node_*,_std::allocator<Fa_Node_*>_> *)local_158,
                                   (long)*pvVar10);
              std::vector<Edge,std::allocator<Edge>>::emplace_back<Fa_Node*&,char&>
                        ((vector<Edge,std::allocator<Edge>> *)&pFVar3->edge,ppFVar7,
                         (char *)&stack0xfffffffffffffcd0);
            }
            __gnu_cxx::__normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>::
            operator++(&__end3_3);
          }
          std::_Rb_tree_const_iterator<int>::operator++(&__end2);
        }
      }
      for (edge_tp._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 1;
          edge_tp._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ <= this->n;
          edge_tp._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
               edge_tp._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1) {
        ppFVar7 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                            (&this->Node,
                             (long)edge_tp._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_);
        pFVar14 = *ppFVar7;
        if (pFVar14 != (Fa_Node *)0x0) {
          Fa_Node::~Fa_Node(pFVar14);
          operator_delete(pFVar14,0x28);
        }
      }
      std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::clear(&this->Node);
      std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator=
                (&this->Node,(vector<Fa_Node_*,_std::allocator<Fa_Node_*>_> *)local_158);
      this->n = local_a8;
      std::set<Edge,_std::less<Edge>,_std::allocator<Edge>_>::set
                ((set<Edge,_std::less<Edge>,_std::allocator<Edge>_> *)local_368);
      for (__range2_1._4_4_ = 1; __range2_1._4_4_ <= this->n;
          __range2_1._4_4_ = __range2_1._4_4_ + 1) {
        std::set<Edge,_std::less<Edge>,_std::allocator<Edge>_>::clear
                  ((set<Edge,_std::less<Edge>,_std::allocator<Edge>_> *)local_368);
        ppFVar7 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                            (&this->Node,(long)__range2_1._4_4_);
        pFVar3 = *ppFVar7;
        __end2_1 = std::vector<Edge,_std::allocator<Edge>_>::begin(&pFVar3->edge);
        j_5.v = (Fa_Node *)std::vector<Edge,_std::allocator<Edge>_>::end(&pFVar3->edge);
        while (bVar4 = __gnu_cxx::operator!=
                                 (&__end2_1,
                                  (__normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>
                                   *)&j_5.v), bVar4) {
          pEVar9 = __gnu_cxx::__normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>::
                   operator*(&__end2_1);
          auStack_398[0] = pEVar9->c;
          auStack_398._1_7_ = *(undefined7 *)&pEVar9->field_0x1;
          j_5._0_8_ = pEVar9->v;
          std::set<Edge,_std::less<Edge>,_std::allocator<Edge>_>::insert
                    ((set<Edge,_std::less<Edge>,_std::allocator<Edge>_> *)local_368,
                     (value_type *)auStack_398);
          __gnu_cxx::__normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>::
          operator++(&__end2_1);
        }
        ppFVar7 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                            (&this->Node,(long)__range2_1._4_4_);
        std::vector<Edge,_std::allocator<Edge>_>::clear(&(*ppFVar7)->edge);
        __end2_2 = std::set<Edge,_std::less<Edge>,_std::allocator<Edge>_>::begin
                             ((set<Edge,_std::less<Edge>,_std::allocator<Edge>_> *)local_368);
        local_3c0._M_node =
             (_Base_ptr)
             std::set<Edge,_std::less<Edge>,_std::allocator<Edge>_>::end
                       ((set<Edge,_std::less<Edge>,_std::allocator<Edge>_> *)local_368);
        while (bVar4 = std::operator!=(&__end2_2,&local_3c0), bVar4) {
          pEVar15 = std::_Rb_tree_const_iterator<Edge>::operator*(&__end2_2);
          auStack_3d8[0] = pEVar15->c;
          auStack_3d8._1_7_ = *(undefined7 *)&pEVar15->field_0x1;
          j_6._0_8_ = pEVar15->v;
          ppFVar7 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                              (&this->Node,(long)__range2_1._4_4_);
          std::vector<Edge,_std::allocator<Edge>_>::push_back
                    (&(*ppFVar7)->edge,(value_type *)auStack_3d8);
          std::_Rb_tree_const_iterator<Edge>::operator++(&__end2_2);
        }
      }
      std::set<Edge,_std::less<Edge>,_std::allocator<Edge>_>::~set
                ((set<Edge,_std::less<Edge>,_std::allocator<Edge>_> *)local_368);
      std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)local_1f0);
      Node_num_edge::~Node_num_edge
                ((Node_num_edge *)&node_tp._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      map<Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<Node_num_edge>,_std::allocator<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
      ::~map((map<Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<Node_num_edge>,_std::allocator<std::pair<const_Node_num_edge,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
              *)&to_tp.n._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::~vector
                ((vector<Fa_Node_*,_std::allocator<Fa_Node_*>_> *)local_158);
      std::
      vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
      ::~vector((vector<std::set<int,_std::less<int>,_std::allocator<int>_>,_std::allocator<std::set<int,_std::less<int>,_std::allocator<int>_>_>_>
                 *)local_138);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)local_108);
      return;
    }
    k = local_a8;
    for (i_2._4_4_ = 1; i_2._4_4_ <= this->n; i_2._4_4_ = i_2._4_4_ + 1) {
      local_b8 = std::vector<Fa_Node_*,_std::allocator<Fa_Node_*>_>::operator[]
                           (&this->Node,(long)i_2._4_4_);
      ___range4 = std::vector<bool,_std::allocator<bool>_>::operator[]
                            (&this->used,(long)(*local_b8)->n);
      bVar5 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&__range4);
      if ((bVar5) && ((bool)((*local_b8)->temp & 1U) != bVar4)) {
        if (((*local_b8)->end & 1U) == 0) {
          pFVar3 = *local_b8;
          __end4 = std::vector<Edge,_std::allocator<Edge>_>::begin(&pFVar3->edge);
          j.v = (Fa_Node *)std::vector<Edge,_std::allocator<Edge>_>::end(&pFVar3->edge);
          while (bVar5 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>
                                             *)&j.v), bVar5) {
            pEVar9 = __gnu_cxx::__normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>
                     ::operator*(&__end4);
            belong.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = *(pointer *)pEVar9;
            j._0_8_ = pEVar9->v;
            if ((bool)(((Fa_Node *)j._0_8_)->temp & 1U) == bVar4) {
              (*local_b8)->temp = bVar4;
              local_a8 = local_a8 + 1;
              break;
            }
            __gnu_cxx::__normal_iterator<Edge_*,_std::vector<Edge,_std::allocator<Edge>_>_>::
            operator++(&__end4);
          }
        }
        else {
          (*local_b8)->temp = bVar4;
          local_a8 = local_a8 + 1;
        }
      }
    }
  } while( true );
}

Assistant:

void Dfa::min_Dfa() {
    used.resize(n + 1);
    for (auto i:used) {
        i = false;
    }
    //delete useless node
    bool okflag = !Node[1]->temp;
    for (auto i:begin) {//delete unreachable nodes
        if (!used[i->n]) {
            dfs_del_unreachable_node(i->n, okflag);
        }
    }

    int last_tot, tot;
    for (last_tot = -1, tot = 0; last_tot != tot;) {//delete unterminated nodes
        last_tot = tot;
        for (int k = 1; k <= n; k++) {
            auto &i = Node[k];
            if (used[i->n]) {
                if (i->temp == okflag) {
                    continue;
                }
                if (i->end) {
                    i->temp = okflag;
                    tot++;
                    continue;
                }
                for (auto j:i->edge) {
                    if (j.v->temp == okflag) {
                        i->temp = okflag;
                        tot++;
                        break;
                    }
                }
            }
        }
    }

    vector<int> belong(n + 1);
    for (int i = 1; i <= n; i++) {
        if (Node[i]->temp == okflag) {
            if (Node[i]->end) {
                belong[i] = 2;
            } else {
                belong[i] = 1;
            }
        } else {
            belong[i] = 0;
        }
    }

    vector<set<int>> new_node_set(3);
    vector<Fa_Node *> new_Node;

    new_Node.push_back(NULL);

    map<Node_num_edge, set<int>> mp;
    Node_num_edge to_tp;
    set<int> node_tp;
    //reach node set -> node set

    tot = 2;
    last_tot = 0;
    //end node set  and not end node set
    for (int i = 1; i <= n; i++) {
        if (Node[i]->temp == okflag) {
            if (Node[i]->end) {
                new_node_set[2].insert(Node[i]->n);
            } else {
                new_node_set[1].insert(Node[i]->n);
            }
        }
    }

    while (last_tot != tot) {
        last_tot = tot;
        for (int i = 1; i <= last_tot; i++) {//all node set
            mp.clear();
            //node_tp.clear();
            for (auto j:new_node_set[i]) {//every node
                to_tp.n.clear();
                for (auto k:Node[j]->edge) {//every edge
                    if (k.v->temp == okflag) {
                        pair<char, int> pair_tp(k.c, belong[k.v->n]);
                        //to_tp.n.insert(make_pair<k.c, belong[k.v->n]>);
                        to_tp.n.insert(pair_tp);
                    }
                }
                mp[to_tp].insert(j);
            }
            //update node set
            int tp_cnt = 0;
            for (const auto &j:mp) {
                if (tp_cnt == 0) {
                    new_node_set[i].clear();
                    new_node_set[i] = j.second;
                    tp_cnt++;
                } else {
                    tot++;
                    new_node_set.push_back(j.second);
                }
            }
        }
        //update belong
        for (int i = 1; i <= tot; i++) {
            for (auto j:new_node_set[i]) {
                belong[j] = i;
            }
        }
    }

    //rebuild DFA
    new_Node.resize(tot + 1);
    for (int i = 1; i <= tot; i++) {
        new_Node[i] = new Fa_Node(i);
    }

    begin.clear();
    end.clear();

    for (int q = 1; q <= tot; q++) {
        for (auto j:new_node_set[q]) {
            int i = belong[j];
            if (Node[j]->start) {
                new_Node[i]->start = true;
                begin.push_back(new_Node[i]);
            }
            if (Node[j]->end) {
                new_Node[i]->end = true;
                end.push_back(new_Node[i]);
            }
            for (auto k:Node[j]->edge) {
                if (k.v->temp == okflag) {
                    new_Node[i]->edge.emplace_back(new_Node[belong[k.v->n]], k.c);
                }
            }
        }
    }

    //delete DFA

    for (int i = 1; i <= n; i++) {
        delete Node[i];
    }

    //update DFA
    Node.clear();
    Node = new_Node;
    n = tot;

    set<Edge> edge_tp;
    //unique edges
    for (int i = 1; i <= n; i++) {
//        if (belong[i] != i) {
//            delete Node[i];
//            continue;
//        }
        edge_tp.clear();
        for (auto j:Node[i]->edge) {
            edge_tp.insert(j);
        }
        Node[i]->edge.clear();
        for (auto j:edge_tp) {
            Node[i]->edge.push_back(j);
        }
    }
}